

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_box.cpp
# Opt level: O2

void Omega_h::make_1d_box(Real x,LO nx,LOs *ev2v_out,Reals *coords_out)

{
  uint size_in;
  ulong uVar1;
  int iVar2;
  Write<int> ev2v;
  Write<double> coords;
  type fill_coords;
  type fill_conn;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  Write<int> local_d8;
  Write<double> local_c8;
  Write<double> *local_b8;
  Real local_b0;
  Write<double> local_a8;
  Write<int> local_98;
  uint local_88 [2];
  Write<double> local_80;
  double local_70;
  uint local_68;
  Write<double> local_60;
  double local_50;
  uint local_48;
  Write<int> local_40;
  
  local_b0 = x;
  std::__cxx11::string::string((string *)local_f8,"",(allocator *)local_88);
  size_in = nx + 1;
  Write<double>::Write(&local_c8,size_in,(string *)local_f8);
  local_b8 = &coords_out->write_;
  std::__cxx11::string::~string((string *)local_f8);
  local_68 = size_in;
  Write<double>::Write(&local_60,&local_c8);
  local_50 = local_b0 / (double)nx;
  local_88[0] = local_68;
  Write<double>::Write(&local_80,&local_60);
  local_70 = local_50;
  if (-1 < nx) {
    entering_parallel = 1;
    local_f8._0_4_ = local_88[0];
    Write<double>::Write((Write<signed_char> *)(local_f8 + 8),(Write<signed_char> *)&local_80);
    local_e8._8_8_ = local_70;
    entering_parallel = 0;
    for (uVar1 = 0; size_in != uVar1; uVar1 = uVar1 + 1) {
      *(double *)(local_e8._M_allocated_capacity + uVar1 * 8) =
           (double)(int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                        (long)(int)local_f8._0_4_) * local_70;
    }
    Write<double>::~Write((Write<double> *)(local_f8 + 8));
  }
  Write<double>::~Write(&local_80);
  std::__cxx11::string::string((string *)local_f8,"",(allocator *)local_88);
  Write<int>::Write(&local_d8,nx * 2,(string *)local_f8);
  std::__cxx11::string::~string((string *)local_f8);
  local_48 = nx;
  Write<int>::Write(&local_40,&local_d8);
  local_88[0] = local_48;
  Write<int>::Write((Write<int> *)&local_80,&local_40);
  if (0 < nx) {
    entering_parallel = 1;
    local_f8._0_4_ = local_88[0];
    Write<int>::Write((Write<int> *)(local_f8 + 8),(Write<int> *)&local_80);
    entering_parallel = 0;
    for (uVar1 = 0; (uint)nx != uVar1; uVar1 = uVar1 + 1) {
      iVar2 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                   (long)(int)local_f8._0_4_);
      *(int *)(local_e8._M_allocated_capacity + uVar1 * 8) = iVar2;
      *(int *)(local_e8._M_allocated_capacity + 4 + uVar1 * 8) = iVar2 + 1;
    }
    Write<int>::~Write((Write<int> *)(local_f8 + 8));
  }
  Write<int>::~Write((Write<int> *)&local_80);
  Write<int>::Write(&local_98,&local_d8);
  Read<int>::Read((Read<signed_char> *)local_f8,&local_98);
  Write<int>::operator=(&ev2v_out->write_,(Write<int> *)local_f8);
  Write<int>::~Write((Write<int> *)local_f8);
  Write<int>::~Write(&local_98);
  Write<double>::Write(&local_a8,&local_c8);
  Read<double>::Read((Read<signed_char> *)local_f8,&local_a8);
  Write<double>::operator=(local_b8,(Write<signed_char> *)local_f8);
  Write<double>::~Write((Write<double> *)local_f8);
  Write<double>::~Write(&local_a8);
  Write<int>::~Write(&local_40);
  Write<int>::~Write(&local_d8);
  Write<double>::~Write(&local_60);
  Write<double>::~Write(&local_c8);
  return;
}

Assistant:

void make_1d_box(Real x, LO nx, LOs* ev2v_out, Reals* coords_out) {
  LO ne = nx;
  LO nv = nx + 1;
  Real dx = x / nx;
  Write<Real> coords(nv);
  auto fill_coords = OMEGA_H_LAMBDA(LO v) {
    LO i = v % nv;
    coords[v] = i * dx;
  };
  parallel_for(nv, fill_coords, "make_1d_box(coords)");
  Write<LO> ev2v(ne * 2);
  auto fill_conn = OMEGA_H_LAMBDA(LO q) {
    LO i = q % ne;
    ev2v[q * 2 + 0] = i + 0;
    ev2v[q * 2 + 1] = i + 1;
  };
  parallel_for(ne, fill_conn, "make_1d_box(conn)");
  *ev2v_out = ev2v;
  *coords_out = coords;
}